

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

bool Js::JavascriptRegExp::IsRegExpLike(Var aValue,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  RecyclableObject *instance;
  Var instance_00;
  
  if (((scriptContext->config).threadConfig)->m_ES6RegExSymbols == true) {
    BVar2 = JavascriptOperators::IsObject(aValue);
    if (BVar2 == 0) {
      bVar1 = false;
    }
    else {
      instance = VarTo<Js::RecyclableObject>(aValue);
      instance_00 = JavascriptOperators::GetProperty
                              (instance,0x15,scriptContext,(PropertyValueInfo *)0x0);
      BVar2 = JavascriptOperators::IsUndefined(instance_00);
      if (BVar2 != 0) goto LAB_00d0408e;
      BVar2 = JavascriptConversion::ToBoolean(instance_00,scriptContext);
      bVar1 = BVar2 != 0;
    }
    return bVar1;
  }
LAB_00d0408e:
  bVar1 = VarIs<Js::JavascriptRegExp>(aValue);
  return bVar1;
}

Assistant:

bool JavascriptRegExp::IsRegExpLike(Var aValue, ScriptContext* scriptContext)
    {
        if (scriptContext->GetConfig()->IsES6RegExSymbolsEnabled())
        {
            if (!JavascriptOperators::IsObject(aValue))
            {
                return false;
            }

            Var symbolMatchProperty = JavascriptOperators::GetProperty(
                VarTo<RecyclableObject>(aValue),
                PropertyIds::_symbolMatch,
                scriptContext);
            if (!JavascriptOperators::IsUndefined(symbolMatchProperty))
            {
                return JavascriptConversion::ToBool(symbolMatchProperty, scriptContext);
            }
        }

        return VarIs<JavascriptRegExp>(aValue);
    }